

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadePrimitives
          (InstancedExpansionShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  float fVar5;
  Vector<float,_4> res;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vec4 local_58;
  float local_48;
  
  if (0 < numPackets) {
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)packets->vertices + lVar4);
      uVar2 = *(undefined8 *)(lVar1 + 8);
      uVar3 = *(undefined8 *)(lVar1 + 0x10);
      fVar5 = ((float)invocationID / (float)*(int *)&(this->super_ShaderProgram).field_0x154) * 6.3;
      local_48 = cosf(fVar5);
      fVar5 = sinf(fVar5);
      local_68 = (float)uVar2;
      fStack_64 = (float)((ulong)uVar2 >> 0x20);
      fStack_60 = (float)uVar3;
      fStack_5c = (float)((ulong)uVar3 >> 0x20);
      local_68 = local_48 * 0.1 + local_68;
      fStack_64 = fVar5 * 0.1 + fStack_64;
      fStack_60 = fStack_60 + 0.0;
      fStack_5c = fStack_5c + 0.0;
      local_58.m_data[0] = local_68 + 0.0;
      local_58.m_data[1] = fStack_64 + -0.1;
      local_58.m_data[2] = fStack_60 + 0.0;
      local_58.m_data[3] = fStack_5c + 0.0;
      rr::GeometryEmitter::EmitVertex
                (output,&local_58,0.0,(GenericVec4 *)0x0,
                 *(int *)((long)packets->vertices + lVar4 + -8));
      local_58.m_data[0] = local_68 + -0.05;
      local_58.m_data[1] = fStack_64 + 0.0;
      local_58.m_data[2] = fStack_60 + 0.0;
      local_58.m_data[3] = fStack_5c + 0.0;
      rr::GeometryEmitter::EmitVertex
                (output,&local_58,0.0,(GenericVec4 *)0x0,
                 *(int *)((long)packets->vertices + lVar4 + -8));
      local_58.m_data[0] = local_68 + 0.05;
      local_58.m_data[1] = fStack_64 + 0.0;
      local_58.m_data[2] = fStack_60 + 0.0;
      local_58.m_data[3] = fStack_5c + 0.0;
      rr::GeometryEmitter::EmitVertex
                (output,&local_58,0.0,(GenericVec4 *)0x0,
                 *(int *)((long)packets->vertices + lVar4 + -8));
      rr::GeometryEmitter::EndPrimitive(output);
      lVar4 = lVar4 + 0x38;
    } while ((ulong)(uint)numPackets * 0x38 - lVar4 != 0);
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex			= packets[packetNdx].vertices[0];
		const tcu::Vec4			basePosition	= vertex->position;
		const float				phase			= float(invocationID) / float(m_numInvocations) * 6.3f;
		const tcu::Vec4			centerPosition	= basePosition + tcu::Vec4(deFloatCos(phase), deFloatSin(phase), 0.0f, 0.0f) * 0.1f;

		output.EmitVertex(centerPosition + tcu::Vec4( 0.0f,  -0.1f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4(-0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4( 0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EndPrimitive();
	}
}